

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::Json_ActiveOperationalDatasetEncodingDecoding_Test::TestBody
          (Json_ActiveOperationalDatasetEncodingDecoding_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<ot::commissioner::ChannelMaskEntry> __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ActiveOperationalDataset *aDataset;
  ByteArray *aBytes;
  ActiveOperationalDataset *aDataset_00;
  ActiveOperationalDataset *aDataset_01;
  char *in_R9;
  ChannelMaskEntry *local_8e0;
  string local_8a0;
  AssertHelper local_880;
  Message local_878;
  bool local_869;
  undefined1 local_868 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_838;
  Message local_830;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_7f0;
  Message local_7e8;
  bool local_7d9;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_7a8;
  Message local_7a0;
  uint local_794;
  undefined1 local_790 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_760;
  Message local_758;
  ErrorCode local_74c;
  Error local_748;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__6;
  ActiveOperationalDataset dataset1_2;
  string json_2;
  ChannelMaskEntry local_5f0;
  iterator local_5d0;
  pointer local_5c8;
  AssertHelper local_5c0;
  Message local_5b8;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_580;
  Message local_578;
  uint local_56c;
  undefined1 local_568 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_538;
  Message local_530;
  ErrorCode local_524;
  Error local_520;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__4;
  ActiveOperationalDataset dataset1_1;
  string json_1;
  undefined1 local_3d0 [8];
  ByteArray kSecurityPolicyFlags;
  AssertHelper local_398;
  Message local_390;
  string local_388;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_330;
  Message local_328;
  uint local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2e8;
  Message local_2e0;
  ErrorCode local_2d4;
  Error local_2d0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__1;
  ActiveOperationalDataset dataset1;
  string json;
  AssertHelper local_178;
  Message local_170;
  ErrorCode local_164;
  Error local_160;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  ActiveOperationalDataset dataset;
  allocator local_31;
  undefined1 local_30 [8];
  string kNetworkMasterKey;
  Json_ActiveOperationalDatasetEncodingDecoding_Test *this_local;
  
  kNetworkMasterKey.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"0123456789abcdef0123456789abcdef",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ActiveOperationalDataset::ActiveOperationalDataset
            ((ActiveOperationalDataset *)&gtest_ar_.message_);
  utils::Hex(&local_160,
             (ByteArray *)
             &dataset.mMeshLocalPrefix.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)local_30);
  local_164 = kNone;
  local_131 = commissioner::operator==(&local_160,&local_164);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  Error::~Error(&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&json.field_2 + 8),(internal *)local_130,
               (AssertionResult *)
               "utils::Hex(dataset.mNetworkMasterKey, kNetworkMasterKey) == ErrorCode::kNone",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)(json.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  dataset.mSecurityPolicy.mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ =
       dataset.mSecurityPolicy.mFlags.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._1_1_ | 4;
  ActiveDatasetToJson_abi_cxx11_
            ((string *)&dataset1.mPresentFlags,(commissioner *)&gtest_ar_.message_,aDataset);
  ActiveOperationalDataset::ActiveOperationalDataset
            ((ActiveOperationalDataset *)&gtest_ar__1.message_);
  ActiveDatasetFromJson
            (&local_2d0,(ActiveOperationalDataset *)&gtest_ar__1.message_,
             (string *)&dataset1.mPresentFlags);
  local_2d4 = kNone;
  local_2a1 = commissioner::operator==(&local_2d0,&local_2d4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  Error::~Error(&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_2a0,
               (AssertionResult *)"ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_31c = (ushort)dataset1.mSecurityPolicy.mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 0x400;
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_318,(int *)&local_31c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_318,
               (AssertionResult *)
               "(dataset1.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  utils::Hex_abi_cxx11_
            (&local_388,
             (utils *)&dataset1.mMeshLocalPrefix.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,aBytes);
  local_361 = std::operator==(&local_388,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &kSecurityPolicyFlags.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_360,
               (AssertionResult *)"utils::Hex(dataset1.mNetworkMasterKey) == kNetworkMasterKey",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string
              ((string *)
               &kSecurityPolicyFlags.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  ActiveOperationalDataset::~ActiveOperationalDataset
            ((ActiveOperationalDataset *)&gtest_ar__1.message_);
  std::__cxx11::string::~string((string *)&dataset1.mPresentFlags);
  json_1.field_2._M_local_buf[0xe] = '\x05';
  json_1.field_2._M_local_buf[0xf] = -1;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)(json_1.field_2._M_local_buf + 0xd));
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)((long)&json_1.field_2 + 0xe);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0,__l_01,
             (allocator<unsigned_char> *)(json_1.field_2._M_local_buf + 0xd));
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)(json_1.field_2._M_local_buf + 0xd));
  dataset.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0x20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataset.mSecurityPolicy,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
  dataset.mSecurityPolicy.mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
       (byte)dataset.mSecurityPolicy.mFlags.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage | 0x40;
  ActiveDatasetToJson_abi_cxx11_
            ((string *)&dataset1_1.mPresentFlags,(commissioner *)&gtest_ar_.message_,aDataset_00);
  ActiveOperationalDataset::ActiveOperationalDataset
            ((ActiveOperationalDataset *)&gtest_ar__4.message_);
  ActiveDatasetFromJson
            (&local_520,(ActiveOperationalDataset *)&gtest_ar__4.message_,
             (string *)&dataset1_1.mPresentFlags);
  local_524 = kNone;
  local_4f1 = commissioner::operator==(&local_520,&local_524);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
  Error::~Error(&local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_4f0,
               (AssertionResult *)"ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_538,&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  local_56c = (ushort)dataset1_1.mSecurityPolicy.mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 0x40;
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_568,(int *)&local_56c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_568,
               (AssertionResult *)
               "(dataset1.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_580,&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  testing::internal::EqHelper::
  Compare<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_5b0,"dataset1.mSecurityPolicy.mFlags","kSecurityPolicyFlags",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataset1_1.mSecurityPolicy,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  ActiveOperationalDataset::~ActiveOperationalDataset
            ((ActiveOperationalDataset *)&gtest_ar__4.message_);
  std::__cxx11::string::~string((string *)&dataset1_1.mPresentFlags);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3d0);
  json_2.field_2._M_local_buf[0xc] = '\x01';
  local_5f0.mPage = '\x01';
  json_2.field_2._M_local_buf[0xe] = -1;
  json_2.field_2._M_local_buf[0xf] = -0x12;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)(json_2.field_2._M_local_buf + 0xd));
  __l._M_len = 2;
  __l._M_array = (iterator)((long)&json_2.field_2 + 0xe);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_5f0.mMasks,__l,(allocator<unsigned_char> *)(json_2.field_2._M_local_buf + 0xd));
  json_2.field_2._M_local_buf[0xc] = '\0';
  local_5d0 = &local_5f0;
  local_5c8 = (pointer)0x1;
  __l_00._M_len = 1;
  __l_00._M_array = local_5d0;
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  operator=((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
             *)&dataset.mChannel,__l_00);
  local_8e0 = (ChannelMaskEntry *)&local_5d0;
  do {
    local_8e0 = local_8e0 + -1;
    ChannelMaskEntry::~ChannelMaskEntry(local_8e0);
  } while (local_8e0 != &local_5f0);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)(json_2.field_2._M_local_buf + 0xd));
  dataset.mSecurityPolicy.mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ =
       dataset.mSecurityPolicy.mFlags.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._1_1_ | 0x20;
  ActiveDatasetToJson_abi_cxx11_
            ((string *)&dataset1_2.mPresentFlags,(commissioner *)&gtest_ar_.message_,aDataset_01);
  ActiveOperationalDataset::ActiveOperationalDataset
            ((ActiveOperationalDataset *)&gtest_ar__6.message_);
  ActiveDatasetFromJson
            (&local_748,(ActiveOperationalDataset *)&gtest_ar__6.message_,
             (string *)&dataset1_2.mPresentFlags);
  local_74c = kNone;
  local_719 = commissioner::operator==(&local_748,&local_74c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  Error::~Error(&local_748);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_718,
               (AssertionResult *)"ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  local_794 = (ushort)dataset1_2.mSecurityPolicy.mFlags.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 0x2000;
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_790,(int *)&local_794,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_790,
               (AssertionResult *)
               "(dataset1.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit)","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  sVar3 = std::
          vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          ::size((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                  *)&dataset1_2.mChannel);
  local_7d9 = sVar3 == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7d8,&local_7d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_7d8,
               (AssertionResult *)"dataset1.mChannelMask.size() == 1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7f0,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper(&local_7f0);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  pvVar4 = std::
           vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           ::operator[]((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                         *)&dataset1_2.mChannel,0);
  local_821 = pvVar4->mPage == '\x01';
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_820,&local_821,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar1) {
    testing::Message::Message(&local_830);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_820,
               (AssertionResult *)"dataset1.mChannelMask[0].mPage == 1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_838,&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_838);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  pvVar4 = std::
           vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           ::operator[]((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                         *)&dataset1_2.mChannel,0);
  pvVar5 = std::
           vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           ::operator[]((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                         *)&dataset.mChannel,0);
  local_869 = std::operator==(&pvVar4->mMasks,&pvVar5->mMasks);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_868,&local_869,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8a0,(internal *)local_868,
               (AssertionResult *)
               "dataset1.mChannelMask[0].mMasks == dataset.mChannelMask[0].mMasks","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_880,&local_878);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    std::__cxx11::string::~string((string *)&local_8a0);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  ActiveOperationalDataset::~ActiveOperationalDataset
            ((ActiveOperationalDataset *)&gtest_ar__6.message_);
  std::__cxx11::string::~string((string *)&dataset1_2.mPresentFlags);
  ActiveOperationalDataset::~ActiveOperationalDataset
            ((ActiveOperationalDataset *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Json, ActiveOperationalDatasetEncodingDecoding)
{
    const std::string        kNetworkMasterKey = "0123456789abcdef0123456789abcdef";
    ActiveOperationalDataset dataset;

    // network master key serialization & deserialization
    {
        EXPECT_TRUE(utils::Hex(dataset.mNetworkMasterKey, kNetworkMasterKey) == ErrorCode::kNone);
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkMasterKeyBit;

        std::string json = ActiveDatasetToJson(dataset);

        ActiveOperationalDataset dataset1;
        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);

        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit));
        EXPECT_TRUE(utils::Hex(dataset1.mNetworkMasterKey) == kNetworkMasterKey);
    }

    // security policy serialization & deserialization
    {
        const ByteArray kSecurityPolicyFlags  = {0x05, 0xff};
        dataset.mSecurityPolicy.mRotationTime = 32;
        dataset.mSecurityPolicy.mFlags        = kSecurityPolicyFlags;
        dataset.mPresentFlags |= ActiveOperationalDataset::kSecurityPolicyBit;

        std::string              json = ActiveDatasetToJson(dataset);
        ActiveOperationalDataset dataset1;

        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);
        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit));
        EXPECT_EQ(dataset1.mSecurityPolicy.mFlags, kSecurityPolicyFlags);
    }

    // channel mask serialization & deserialization
    {
        dataset.mChannelMask = {{1, {0xFF, 0xEE}}};
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelMaskBit;

        std::string              json = ActiveDatasetToJson(dataset);
        ActiveOperationalDataset dataset1;

        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);
        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit));
        EXPECT_TRUE(dataset1.mChannelMask.size() == 1);
        EXPECT_TRUE(dataset1.mChannelMask[0].mPage == 1);
        EXPECT_TRUE(dataset1.mChannelMask[0].mMasks == dataset.mChannelMask[0].mMasks);
    }
}